

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O2

void __thiscall
capnp::anon_unknown_69::WindowFlowController::WindowFlowController
          (WindowFlowController *this,WindowGetter *windowGetter)

{
  SourceLocation location;
  
  (this->super_RpcFlowController)._vptr_RpcFlowController = (_func_int **)&PTR_send_006660e0;
  (this->super_ErrorHandler)._vptr_ErrorHandler = (_func_int **)&DAT_00666108;
  this->windowGetter = windowGetter;
  (this->emptyFulfiller).ptr.disposer = (Disposer *)0x0;
  (this->emptyFulfiller).ptr.ptr = (PromiseFulfiller<kj::Promise<void>_> *)0x0;
  (this->state).tag = 0;
  this->inFlight = 0;
  this->maxMessageSize = 0;
  location.function = "WindowFlowController";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
  ;
  location.lineNumber = 0x123b;
  location.columnNumber = 0x25;
  kj::TaskSet::TaskSet(&this->tasks,&this->super_ErrorHandler,location);
  kj::OneOf<kj::Vector<kj::Own<kj::PromiseFulfiller<void>,decltype(nullptr)>>,kj::Exception>::
  init<kj::Vector<kj::Own<kj::PromiseFulfiller<void>,decltype(nullptr)>>>
            ((OneOf<kj::Vector<kj::Own<kj::PromiseFulfiller<void>,decltype(nullptr)>>,kj::Exception>
              *)&this->state);
  return;
}

Assistant:

WindowFlowController(RpcFlowController::WindowGetter& windowGetter)
      : windowGetter(windowGetter), tasks(*this) {
    state.init<Running>();
  }